

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  context *ctx;
  bool bVar4;
  int iVar5;
  int iVar6;
  default_cost_type<long_double> *c;
  local_context *ctx_00;
  int push;
  int iVar7;
  long loop;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble theta;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar12;
  double dVar13;
  bit_array x;
  int local_1a0;
  longdouble local_17c;
  default_cost_type<long_double> norm_costs;
  compute_order compute;
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  slv;
  
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  ctx = this->m_ctx;
  ctx_00 = &this->m_local_ctx;
  c = (default_cost_type<long_double> *)ctx_00;
  iVar7 = variables;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&norm_costs,ctx,original_costs,&ctx_00->rng,variables);
  lVar8 = (longdouble)(ctx->parameters).kappa_step;
  lVar9 = (longdouble)(ctx->parameters).kappa_max;
  theta = (longdouble)(ctx->parameters).theta;
  dVar1 = (ctx->parameters).delta;
  if (0.0 <= dVar1) {
    local_17c = (longdouble)dVar1;
    lVar10 = in_ST0;
  }
  else {
    lVar11 = in_ST5;
    compute_delta<long_double,baryonyx::itm::default_cost_type<long_double>>
              ((longdouble *)this->m_ctx,(itm *)&norm_costs,(context *)(ulong)(uint)variables,c,
               theta,iVar7);
    lVar10 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar11;
    local_17c = in_ST0;
  }
  dVar2 = (ctx->parameters).pushing_k_factor;
  dVar3 = (ctx->parameters).pushing_objective_amplifier;
  dVar1 = (ctx->parameters).w;
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::solver_equalities_01coeff
            (&slv,&ctx_00->rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(ctx->parameters).order,variables);
  do {
    bVar4 = false;
LAB_0023ed96:
    if (((stop_task->_M_base)._M_i & 1U) != 0) {
      compute_order::~compute_order(&compute);
      solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
      ::~solver_equalities_01coeff(&slv);
      std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::~unique_ptr
                (&norm_costs.linear_elements);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&x.super_bit_array_impl.m_data);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar12 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
             ::reinit(best_recorder,ctx_00,bVar4,(ctx->parameters).kappa_min,
                      (ctx->parameters).kappa_max,&x);
    compute_order::
    init<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
              (&compute,&slv,&x);
    iVar7 = 0x7fffffff;
    lVar11 = (longdouble)dVar12;
    for (loop = 0; (((stop_task->_M_base)._M_i & 1U) == 0 && (loop != (ctx->parameters).limit));
        loop = loop + 1) {
      iVar5 = compute_order::
              run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        (&compute,&slv,&x,&ctx_00->rng,lVar11,local_17c,theta);
      if (iVar5 == 0) {
        dVar13 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx_00,&x,dVar13,loop);
        bVar4 = true;
        goto LAB_0023ef41;
      }
      if (iVar5 <= iVar7) {
        iVar7 = iVar5;
      }
      if ((long)dVar1 < loop) {
        powl();
        lVar11 = lVar11 + lVar8 * lVar10;
        lVar10 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      in_ST5 = in_ST4;
      if (lVar9 < lVar11) break;
    }
    if (iVar7 < 1) {
      bVar4 = false;
LAB_0023ef41:
      local_1a0 = 0;
      for (iVar7 = 0;
          (((stop_task->_M_base)._M_i & 1U) == 0 && (iVar7 < (ctx->parameters).pushes_limit));
          iVar7 = iVar7 + 1) {
        iVar5 = compute_order::
                push_and_run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                          (&compute,&slv,&x,&ctx_00->rng,(longdouble)dVar2,local_17c,theta,
                           (longdouble)dVar3);
        if (iVar5 == 0) {
          dVar13 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
          best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,ctx_00,&x,dVar13,
                       (long)~((ctx->parameters).pushing_iteration_limit * iVar7));
          bVar4 = true;
        }
        iVar5 = 1;
        lVar11 = (longdouble)dVar12;
        while( true ) {
          if ((((stop_task->_M_base)._M_i & 1U) != 0) ||
             ((ctx->parameters).pushing_iteration_limit <= iVar5 + -1)) goto LAB_0023f121;
          iVar6 = compute_order::
                  run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                            (&compute,&slv,&x,&ctx_00->rng,lVar11,local_17c,theta);
          if (iVar6 == 0) break;
          if ((ctx->parameters).w < (double)(iVar5 + -1)) {
            powl();
            lVar11 = lVar11 + lVar8 * lVar10;
            lVar10 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
          }
          in_ST5 = in_ST4;
          if (lVar9 < lVar11) goto LAB_0023f121;
          iVar5 = iVar5 + 1;
        }
        dVar13 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx_00,&x,dVar13,
                     (long)((ctx->parameters).pushing_iteration_limit * local_1a0 - iVar5));
        bVar4 = true;
LAB_0023f121:
        local_1a0 = local_1a0 + -1;
      }
      goto LAB_0023ed96;
    }
    best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
    ::try_advance(best_recorder,ctx_00,&x,iVar7,(ctx->parameters).limit);
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }